

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_ParamHolderAlloc(TA_FuncHandle *handle,TA_ParamHolder **allocatedParams)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  TA_ParamHolder *paramsToFree;
  void *pvVar8;
  double *pdVar9;
  void *pvVar10;
  long lVar11;
  undefined8 *puVar12;
  int iVar13;
  ulong uVar14;
  TA_RetCode TVar15;
  
  if (allocatedParams == (TA_ParamHolder **)0x0 || handle == (TA_FuncHandle *)0x0) {
    return TA_BAD_PARAM;
  }
  if (*handle == 0xa201b201) {
    pvVar4 = *(void **)(handle + 2);
    if (pvVar4 == (void *)0x0) {
      return TA_INVALID_HANDLE;
    }
    paramsToFree = (TA_ParamHolder *)calloc(1,0x38);
    TVar15 = TA_ALLOC_ERR;
    if (paramsToFree != (TA_ParamHolder *)0x0) {
      *(undefined4 *)&paramsToFree[1].hiddenData = 0xa202b202;
      paramsToFree->hiddenData = paramsToFree + 1;
      uVar1 = *(uint *)((long)pvVar4 + 0x24);
      if ((ulong)uVar1 == 0) {
        return TA_INTERNAL_ERROR|TA_BAD_PARAM;
      }
      pvVar8 = calloc(1,(ulong)(uVar1 * 0x38));
      if (pvVar8 != (void *)0x0) {
        paramsToFree[2].hiddenData = pvVar8;
        uVar2 = *(uint *)((long)pvVar4 + 0x28);
        if ((ulong)uVar2 == 0) {
          pdVar9 = (double *)0x0;
        }
        else {
          pdVar9 = (double *)calloc(1,(ulong)(uVar2 << 4));
          if (pdVar9 == (double *)0x0) goto LAB_00188965;
        }
        paramsToFree[3].hiddenData = pdVar9;
        uVar3 = *(uint *)((long)pvVar4 + 0x2c);
        pvVar10 = calloc(1,(ulong)(uVar3 << 4));
        if (pvVar10 != (void *)0x0) {
          paramsToFree[4].hiddenData = pvVar10;
          paramsToFree[6].hiddenData = pvVar4;
          lVar11 = *(long *)(handle + 4);
          lVar5 = *(long *)(handle + 6);
          lVar6 = *(long *)(handle + 8);
          puVar12 = (undefined8 *)((long)pvVar8 + 0x30);
          iVar13 = 0;
          for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
            *puVar12 = *(undefined8 *)(lVar11 + uVar14 * 8);
            iVar13 = iVar13 * 2 + 1;
            puVar12 = puVar12 + 7;
          }
          *(int *)&paramsToFree[5].hiddenData = iVar13;
          for (uVar14 = 0; uVar14 < uVar2; uVar14 = uVar14 + 1) {
            piVar7 = *(int **)(lVar5 + uVar14 * 8);
            pdVar9[1] = (double)piVar7;
            if (*piVar7 == 0) {
              *pdVar9 = *(double *)(piVar7 + 10);
            }
            else {
              *(int *)pdVar9 = (int)*(double *)(piVar7 + 10);
            }
            pdVar9 = pdVar9 + 2;
          }
          TVar15 = TA_SUCCESS;
          iVar13 = 0;
          for (lVar11 = 0; (ulong)uVar3 << 3 != lVar11; lVar11 = lVar11 + 8) {
            *(undefined8 *)((long)pvVar10 + lVar11 * 2 + 8) = *(undefined8 *)(lVar6 + lVar11);
            iVar13 = iVar13 * 2 + 1;
            *(int *)((long)&paramsToFree[5].hiddenData + 4) = iVar13;
          }
          goto LAB_001888d9;
        }
      }
LAB_00188965:
      TA_ParamHolderFree(paramsToFree);
    }
  }
  else {
    TVar15 = TA_INVALID_HANDLE;
  }
  paramsToFree = (TA_ParamHolder *)0x0;
LAB_001888d9:
  *allocatedParams = paramsToFree;
  return TVar15;
}

Assistant:

TA_RetCode TA_ParamHolderAlloc( const TA_FuncHandle *handle,
                                TA_ParamHolder **allocatedParams )
{

   TA_FuncDef *funcDef;
   unsigned int allocSize, i;
   TA_ParamHolderInput    *input;
   TA_ParamHolderOptInput *optInput;
   TA_ParamHolderOutput   *output;

   const TA_FuncInfo *funcInfo;
   TA_ParamHolder *newParams;
   TA_ParamHolderPriv *newParamsPriv;

   const TA_InputParameterInfo    **inputInfo;
   const TA_OptInputParameterInfo **optInputInfo;
   const TA_OutputParameterInfo   **outputInfo;

   /* Validate the parameters. */
   if( !handle || !allocatedParams)
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      *allocatedParams = NULL;
      return TA_INVALID_HANDLE;
   }

   /* Get the TA_FuncInfo. */
   funcInfo = funcDef->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   /* Allocate the TA_ParamHolder. */
   newParams = (TA_ParamHolder *)TA_Malloc( sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv));
   if( !newParams )
   {
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }

   memset( newParams, 0, sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv) );
   newParamsPriv = (TA_ParamHolderPriv *)(((char *)newParams)+sizeof(TA_ParamHolder));
   newParamsPriv->magicNumber = TA_PARAM_HOLDER_PRIV_MAGIC_NB;
   newParams->hiddenData = newParamsPriv;

   /* From this point, TA_ParamHolderFree can be safely called. */

   /* Allocate the array of structure holding the info
    * for each parameter.
    */
   if( funcInfo->nbInput == 0 ) return TA_INTERNAL_ERROR(2);

   allocSize = (funcInfo->nbInput) * sizeof(TA_ParamHolderInput);
   input = (TA_ParamHolderInput *)TA_Malloc( allocSize );

   if( !input )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( input, 0, allocSize );
   newParamsPriv->in = input;

   if( funcInfo->nbOptInput == 0 )
      optInput = NULL;
   else
   {
      allocSize = (funcInfo->nbOptInput) * sizeof(TA_ParamHolderOptInput);
      optInput = (TA_ParamHolderOptInput *)TA_Malloc( allocSize );

      if( !optInput )
      {
         TA_ParamHolderFree( newParams );
         *allocatedParams = NULL;
         return TA_ALLOC_ERR;
      }
      memset( optInput, 0, allocSize );
   }
   newParamsPriv->optIn = optInput;

   allocSize = (funcInfo->nbOutput) * sizeof(TA_ParamHolderOutput);
   output = (TA_ParamHolderOutput *)TA_Malloc( allocSize );
   if( !output )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( output, 0, allocSize );
   newParamsPriv->out = output;

   newParamsPriv->funcInfo = funcInfo;

   inputInfo    = (const TA_InputParameterInfo **)funcDef->input;
   optInputInfo = (const TA_OptInputParameterInfo **)funcDef->optInput;
   outputInfo   = (const TA_OutputParameterInfo   **)funcDef->output;

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      input[i].inputInfo = inputInfo[i];
      newParamsPriv->inBitmap <<= 1;
      newParamsPriv->inBitmap |= 1;
   }

   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      optInput[i].optInputInfo = optInputInfo[i];
      if( optInput[i].optInputInfo->type == TA_OptInput_RealRange )
         optInput[i].data.optInReal = optInputInfo[i]->defaultValue;
      else
         optInput[i].data.optInInteger = (TA_Integer)optInputInfo[i]->defaultValue;
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      output[i].outputInfo = outputInfo[i];
      newParamsPriv->outBitmap <<= 1;
      newParamsPriv->outBitmap |= 1;
   }

   /* Succcess, return the result to the caller. */
   *allocatedParams = newParams;

   return TA_SUCCESS;
}